

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Face(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  bool bVar1;
  int flags;
  AActor *self;
  char *pcVar2;
  AActor *other;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004012e4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004012cb:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004012e4:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_00401119;
    bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004012e4;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_004012cb;
LAB_00401119:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00401303;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_004012d4:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00401303:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1f,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_0040116a;
    bVar1 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "faceto == NULL || faceto->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00401303;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_004012d4;
LAB_0040116a:
    other = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_004013b0;
    }
    local_30.Degrees = (double)param[2].field_0.field_1.a;
LAB_004011a7:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004013cf:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc21,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_38.Degrees = (double)param[3].field_0.field_1.a;
LAB_004011b8:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0040137f:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc22,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_40.Degrees = (double)param[4].field_0.field_1.a;
LAB_004011c9:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00401360:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc23,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_48.Degrees = (double)param[5].field_0.field_1.a;
LAB_004011da:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00401341:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc24,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    flags = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_004013b0:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc20,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_30.Degrees = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_004011a7;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_004013cf;
    }
    local_38.Degrees = (double)param[3].field_0.field_1.a;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_004011b8;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_0040137f;
    }
    local_40.Degrees = (double)param[4].field_0.field_1.a;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_004011c9;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00401360;
    }
    local_48.Degrees = (double)param[5].field_0.field_1.a;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_004011da;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00401341;
    }
    flags = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\x01') {
        pcVar2 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_00401322;
      }
      goto LAB_004011f4;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\x01') {
    pcVar2 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00401322:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc25,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_004011f4:
  A_Face(self,other,&local_30,&local_38,&local_40,&local_48,flags,param[7].field_0.f);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Face)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(faceto, AActor)
	PARAM_ANGLE_DEF(max_turn)		
	PARAM_ANGLE_DEF(max_pitch)		
	PARAM_ANGLE_DEF(ang_offset)		
	PARAM_ANGLE_DEF(pitch_offset)	
	PARAM_INT_DEF(flags)			
	PARAM_FLOAT_DEF(z_add)			

	A_Face(self, faceto, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}